

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall clunk::Node::GenerateMoves<true,true>(Node *this,int depth)

{
  int iVar1;
  uint local_2c;
  uint local_28;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int from;
  int depth_local;
  Node *this_local;
  
  if (_piece != '\0') {
    __assert_fail("!_piece[0].type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8aa,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (DAT_001948b4 != '\f') {
    __assert_fail("_piece[WhiteKingOffset].type == (White|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ab,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (DAT_001948b6 != '\r') {
    __assert_fail("_piece[BlackKingOffset].type == (Black|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ac,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (*_KING != '\f') {
    __assert_fail("_KING[White]->type == (White|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ad,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (*PTR_DAT_001883a8 != '\r') {
    __assert_fail("_KING[Black]->type == (Black|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ae,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if ((_KING[1] & 0x88) != 0) {
    __assert_fail("IS_SQUARE(_KING[White]->sqr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8af,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if ((_KING[1] & 0x88) != 0) {
    __assert_fail("IS_SQUARE(_KING[White]->sqr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b0,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if ((undefined *)(&_board)[(byte)_KING[1]] != _KING) {
    __assert_fail("_board[_KING[White]->sqr] == _KING[White]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b1,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if ((undefined *)(&_board)[(byte)PTR_DAT_001883a8[1]] != PTR_DAT_001883a8) {
    __assert_fail("_board[_KING[Black]->sqr] == _KING[Black]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b2,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (0xd < _pcount) {
    __assert_fail("(_pcount[White] >= 0) & (_pcount[White] <= 13)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b3,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (0xd < DAT_00194984) {
    __assert_fail("(_pcount[Black] >= 0) & (_pcount[Black] <= 13)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b4,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (_pcount != DAT_00194998 + DAT_001949a0 + DAT_001949a8) {
    __assert_fail("_pcount[White] == (_pcount[White|Bishop] + _pcount[White|Rook] + _pcount[White|Queen])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b6,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (DAT_00194984 != DAT_0019499c + DAT_001949a4 + DAT_001949ac) {
    __assert_fail("_pcount[Black] == (_pcount[Black|Bishop] + _pcount[Black|Rook] + _pcount[Black|Queen])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b8,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (8 < DAT_00194988) {
    __assert_fail("(_pcount[White|Pawn] >= 0) & (_pcount[White|Pawn] <= 8)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8b9,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (8 < DAT_0019498c) {
    __assert_fail("(_pcount[Black|Pawn] >= 0) & (_pcount[Black|Pawn] <= 8)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8ba,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_00194990) {
    __assert_fail("(_pcount[White|Knight] >= 0) & (_pcount[White|Knight] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8bb,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_00194994) {
    __assert_fail("(_pcount[Black|Knight] >= 0) & (_pcount[Black|Knight] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8bc,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_00194998) {
    __assert_fail("(_pcount[White|Bishop] >= 0) & (_pcount[White|Bishop] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8bd,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_0019499c) {
    __assert_fail("(_pcount[Black|Bishop] >= 0) & (_pcount[Black|Bishop] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8be,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_001949a0) {
    __assert_fail("(_pcount[White|Rook] >= 0) & (_pcount[White|Rook] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8bf,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (10 < DAT_001949a4) {
    __assert_fail("(_pcount[Black|Rook] >= 0) & (_pcount[Black|Rook] <= 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8c0,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (9 < DAT_001949a8) {
    __assert_fail("(_pcount[White|Queen] >= 0) & (_pcount[White|Queen] <= 9)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8c1,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  if (9 < DAT_001949ac) {
    __assert_fail("(_pcount[Black|Queen] >= 0) & (_pcount[Black|Queen] <= 9)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x8c2,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                 );
  }
  this->moveIndex = 0;
  this->moveCount = 0;
  if ((this->checks & 0xffff0000U) == 0) {
    if ((this->checks & 0xff00U) == 0) {
      if ((this->checks & 0xffU) == 0) {
        i_2 = DAT_0019498c;
        while (i_2 != 0) {
          if (i_2 + -1 < 0) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x8d6,
                          "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                         );
          }
          GetPawnMoves<true,true>(this,(uint)(byte)(&DAT_001948b1)[(long)(i_2 + 0xb) * 2],depth);
          i_2 = i_2 + -1;
        }
        i_3 = DAT_00194994;
        while (i_3 != 0) {
          if (i_3 + -1 < 0) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x8dc,
                          "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                         );
          }
          GetKnightMoves<true>(this,true,(uint)(byte)(&DAT_001948b1)[(long)(i_3 + 0x1d) * 2],depth);
          i_3 = i_3 + -1;
        }
        i_4 = DAT_0019499c;
        while (i_4 != 0) {
          if (i_4 + -1 < 0) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x8e2,
                          "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                         );
          }
          GetSliderCaptures(this,true,BishopMove,
                            *(uint64_t *)
                             (_atk + (long)(int)((byte)(&DAT_001948b1)[(long)(i_4 + 0x31) * 2] + 8)
                                     * 8),(uint)(byte)(&DAT_001948b1)[(long)(i_4 + 0x31) * 2]);
          i_4 = i_4 + -1;
        }
        local_28 = DAT_001949a4;
        while (local_28 != 0) {
          if ((int)(local_28 - 1) < 0) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x8ed,
                          "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                         );
          }
          GetSliderCaptures(this,true,RookMove,
                            *(uint64_t *)
                             (_atk + (long)(int)((byte)(&DAT_001948b1)
                                                       [(long)(int)(local_28 + 0x45) * 2] + 8) * 8),
                            (uint)(byte)(&DAT_001948b1)[(long)(int)(local_28 + 0x45) * 2]);
          local_28 = local_28 - 1;
        }
        local_2c = DAT_001949ac;
        while (local_2c != 0) {
          if ((int)(local_2c - 1) < 0) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x8f8,
                          "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]"
                         );
          }
          GetSliderCaptures(this,true,QueenMove,
                            *(uint64_t *)
                             (_atk + (long)(int)((byte)(&DAT_001948b1)
                                                       [(long)(int)(local_2c + 0x59) * 2] + 8) * 8),
                            (uint)(byte)(&DAT_001948b1)[(long)(int)(local_2c + 0x59) * 2]);
          local_2c = local_2c - 1;
        }
        if ((DAT_00194984 != 0) && (depth == 0)) {
          GetSliderChecks<true>(this);
        }
        GetKingMoves<true,true>(this,depth);
        iVar1 = DuplicateMoveCount(this);
        if (iVar1 != 0) {
          __assert_fail("!DuplicateMoveCount()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x907,
                        "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]")
          ;
        }
      }
      else {
        GetCheckEvasions<true>(this);
        iVar1 = DuplicateMoveCount(this);
        if (iVar1 != 0) {
          __assert_fail("!DuplicateMoveCount()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x8d0,
                        "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]")
          ;
        }
      }
    }
    else {
      if ((this->checks & 0xffU) == 0) {
        __assert_fail("checks & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x8c8,
                      "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]");
      }
      GetKingEscapes<true>(this);
      iVar1 = DuplicateMoveCount(this);
      if (iVar1 != 0) {
        __assert_fail("!DuplicateMoveCount()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x8ca,
                      "void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]");
      }
    }
    return;
  }
  __assert_fail("!(checks & ~0xFFFF)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x8c6,"void clunk::Node::GenerateMoves(const int) [color = true, qsearch = true]");
}

Assistant:

void GenerateMoves(const int depth) {
    assert(!_piece[0].type);
    assert(_piece[WhiteKingOffset].type == (White|King));
    assert(_piece[BlackKingOffset].type == (Black|King));
    assert(_KING[White]->type == (White|King));
    assert(_KING[Black]->type == (Black|King));
    assert(IS_SQUARE(_KING[White]->sqr));
    assert(IS_SQUARE(_KING[White]->sqr));
    assert(_board[_KING[White]->sqr] == _KING[White]);
    assert(_board[_KING[Black]->sqr] == _KING[Black]);
    assert((_pcount[White] >= 0) & (_pcount[White] <= 13));
    assert((_pcount[Black] >= 0) & (_pcount[Black] <= 13));
    assert(_pcount[White] == (_pcount[White|Bishop] + _pcount[White|Rook] +
                              _pcount[White|Queen]));
    assert(_pcount[Black] == (_pcount[Black|Bishop] + _pcount[Black|Rook] +
                              _pcount[Black|Queen]));
    assert((_pcount[White|Pawn] >= 0) & (_pcount[White|Pawn] <= 8));
    assert((_pcount[Black|Pawn] >= 0) & (_pcount[Black|Pawn] <= 8));
    assert((_pcount[White|Knight] >= 0) & (_pcount[White|Knight] <= 10));
    assert((_pcount[Black|Knight] >= 0) & (_pcount[Black|Knight] <= 10));
    assert((_pcount[White|Bishop] >= 0) & (_pcount[White|Bishop] <= 10));
    assert((_pcount[Black|Bishop] >= 0) & (_pcount[Black|Bishop] <= 10));
    assert((_pcount[White|Rook] >= 0) & (_pcount[White|Rook] <= 10));
    assert((_pcount[Black|Rook] >= 0) & (_pcount[Black|Rook] <= 10));
    assert((_pcount[White|Queen] >= 0) & (_pcount[White|Queen] <= 9));
    assert((_pcount[Black|Queen] >= 0) & (_pcount[Black|Queen] <= 9));

    moveCount = moveIndex = 0;

    assert(!(checks & ~0xFFFF));
    if (checks & 0xFF00) { // double check
      assert(checks & 0xFF);
      GetKingEscapes<color>();
      assert(!DuplicateMoveCount());
      return;
    }

    if (checks & 0xFF) { // single check
      GetCheckEvasions<color>();
      assert(!DuplicateMoveCount());
      return;
    }

    int from;
    for (int i = _pcount[color|Pawn]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackPawnOffset : PawnOffset) + i].sqr;
      GetPawnMoves<color, qsearch>(from, depth);
    }

    for (int i = _pcount[color|Knight]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackKnightOffset : KnightOffset) + i].sqr;
      GetKnightMoves<qsearch>(color, from, depth);
    }

    for (int i = _pcount[color|Bishop]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackBishopOffset : BishopOffset) + i].sqr;
      if (qsearch) {
        GetSliderCaptures(color, BishopMove, _atk[from + 8], from);
      }
      else {
        GetSliderMoves(color, BishopMove, _bishopRook[from], from);
      }
    }

    for (int i = _pcount[color|Rook]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackRookOffset : RookOffset) + i].sqr;
      if (qsearch) {
        GetSliderCaptures(color, RookMove, _atk[from + 8], from);
      }
      else {
        GetSliderMoves(color, RookMove, _bishopRook[from + 8], from);
      }
    }

    for (int i = _pcount[color|Queen]; i--; ) {
      assert(i >= 0);
      from = _piece[(color ? BlackQueenOffset : QueenOffset) + i].sqr;
      if (qsearch) {
        GetSliderCaptures(color, QueenMove, _atk[from + 8], from);
      }
      else {
        GetSliderMoves(color, QueenMove, _queenKing[from], from);
      }
    }

    if (qsearch && _pcount[color] && !depth) {
      GetSliderChecks<color>();
    }

    GetKingMoves<color, qsearch>(depth);
    assert(!DuplicateMoveCount());
  }